

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O2

int lws_plat_ifconfig(int fd,lws_dhcpc_ifstate_t *is)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *format;
  char local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  lws_strncpy(local_48,is->ifname,0x10);
  lws_plat_if_up(is->ifname,fd,0);
  local_38 = *(undefined8 *)is->sa46;
  uStack_30 = *(undefined8 *)((long)is->sa46 + 8);
  iVar2 = ioctl(fd,0x8916,local_48);
  if (iVar2 < 0) {
    format = "%s: SIOCSIFADDR fail\n";
  }
  else {
    if (is->sa46[0].sa4.sin_family != 2) {
      lws_plat_if_up(is->ifname,fd,1);
      return 0;
    }
    local_38 = CONCAT44(is->nums[0],2);
    uStack_30 = 0;
    iVar2 = ioctl(fd,0x891c);
    if (-1 < iVar2) {
      lws_plat_if_up(is->ifname,fd,1);
      iVar2 = ioctl(fd,0x890b);
      if (-1 < iVar2) {
        return 0;
      }
      uVar1 = *(uint *)((long)is->sa46 + 0x54);
      puVar3 = (uint *)__errno_location();
      _lws_log(1,"%s: SIOCADDRT 0x%x fail: %d\n","lws_plat_ifconfig",
               (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18),(ulong)*puVar3);
      return 1;
    }
    format = "%s: SIOCSIFNETMASK fail\n";
  }
  _lws_log(1,format,"lws_plat_ifconfig");
  return 1;
}

Assistant:

int
lws_plat_ifconfig(int fd, lws_dhcpc_ifstate_t *is)
{
#if defined(__linux__)
	struct rtentry route;
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	memset(&route, 0, sizeof(route));

	lws_strncpy(ifr.ifr_name, is->ifname, IFNAMSIZ);

	lws_plat_if_up(is->ifname, fd, 0);

	memcpy(&ifr.ifr_addr, &is->sa46[LWSDH_SA46_IP], sizeof(struct sockaddr));
	if (ioctl(fd, SIOCSIFADDR, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFADDR fail\n", __func__);
		return 1;
	}

	if (is->sa46[LWSDH_SA46_IP].sa4.sin_family == AF_INET) {
		struct sockaddr_in sin;

		memset(&sin, 0, sizeof(sin));
		sin.sin_family = AF_INET;
		sin.sin_addr.s_addr = *(uint32_t *)&is->nums[LWSDH_IPV4_SUBNET_MASK];
		memcpy(&ifr.ifr_addr, &sin, sizeof(struct sockaddr));
		if (ioctl(fd, SIOCSIFNETMASK, &ifr) < 0) {
			lwsl_err("%s: SIOCSIFNETMASK fail\n", __func__);
			return 1;
		}

		lws_plat_if_up(is->ifname, fd, 1);

		memcpy(&route.rt_gateway,
		       &is->sa46[LWSDH_SA46_IPV4_ROUTER].sa4,
		       sizeof(struct sockaddr));

		sin.sin_addr.s_addr = 0;
		memcpy(&route.rt_dst, &sin, sizeof(struct sockaddr));
		memcpy(&route.rt_genmask, &sin, sizeof(struct sockaddr));

		route.rt_flags = RTF_UP | RTF_GATEWAY;
		route.rt_metric = 100;
		route.rt_dev = (char *)is->ifname;

		if (ioctl(fd, SIOCADDRT, &route) < 0) {
			lwsl_err("%s: SIOCADDRT 0x%x fail: %d\n", __func__,
				(unsigned int)htonl(*(uint32_t *)&is->
					sa46[LWSDH_SA46_IPV4_ROUTER].
						sa4.sin_addr.s_addr), LWS_ERRNO);
			return 1;
		}
	} else
		lws_plat_if_up(is->ifname, fd, 1);

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}